

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O2

void lvm_debug(int ins_len)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  char cVar5;
  char *pcVar6;
  string *str_00;
  uint break_num;
  int local_25c;
  string break_adr;
  string str;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  long local_1a8;
  string local_1a0 [16];
  uint auStack_190 [88];
  
  local_25c = ins_len;
  if (!debug_flag) {
    puts(&DAT_00107839);
  }
  debug_flag = true;
  printf("IP--------->%08X\n",(ulong)registe_ptr->IP);
  while( true ) {
    std::__cxx11::string::string((string *)&str,"",(allocator *)&ss);
    std::operator<<((ostream *)&std::cout,">>>>");
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&str);
    } while (str._M_string_length == 0);
    bVar2 = std::operator==(&str,"n");
    if (bVar2) {
      lvm_debug_n(local_25c);
      goto LAB_0010608c;
    }
    bVar2 = std::operator==(&str,"e");
    if (bVar2) {
      lvm_debug_e();
      goto LAB_0010608c;
    }
    bVar2 = std::operator==(&str,"c");
    if (bVar2) break;
    bVar2 = std::operator==(&str,"u");
    if (bVar2) {
      lvm_debug_u();
    }
    else {
      bVar2 = std::operator==(&str,"p");
      if (bVar2) {
        lvm_debug_p();
      }
      else {
        cVar1 = *str._M_dataplus._M_p;
        cVar5 = (char)&str;
        if (cVar1 == 's') {
          if (str._M_dataplus._M_p[1] == 'b') {
            sVar4 = std::__cxx11::string::find(cVar5,0x20);
            pcVar6 = stack_ptr;
            if (sVar4 != 0xffffffffffffffff) {
              std::__cxx11::string::string((string *)&local_218,(string *)&str);
              str_00 = &local_218;
              lvm_debug_d_s(pcVar6,str_00,sVar4);
              goto LAB_00106063;
            }
            goto LAB_0010600a;
          }
LAB_00106001:
          pcVar6 = &DAT_00107876;
        }
        else {
          if (cVar1 == 'd') {
            if (str._M_dataplus._M_p[1] == 'b') {
              sVar4 = std::__cxx11::string::find(cVar5,0x20);
              pcVar6 = data_ptr;
              if (sVar4 != 0xffffffffffffffff) {
                std::__cxx11::string::string((string *)&local_1f8,(string *)&str);
                str_00 = &local_1f8;
                lvm_debug_d_s(pcVar6,str_00,sVar4);
                goto LAB_00106063;
              }
              goto LAB_0010600a;
            }
            goto LAB_00106001;
          }
          if (cVar1 != 'b') goto LAB_00106001;
          lVar3 = std::__cxx11::string::find(cVar5,0x20);
          if (lVar3 != -1) {
            std::__cxx11::string::substr((ulong)&break_adr,(ulong)&str);
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            std::__cxx11::string::string((string *)&local_1d8,"",(allocator *)&break_num);
            std::__cxx11::stringbuf::str(local_1a0);
            std::__cxx11::string::~string((string *)&local_1d8);
            break_num = 0;
            std::__cxx11::string::substr((ulong)&local_1d8,(ulong)&break_adr);
            bVar2 = std::operator==(&local_1d8,"0x");
            std::__cxx11::string::~string((string *)&local_1d8);
            if (bVar2) {
              *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
              std::__cxx11::string::substr((ulong)&local_1d8,(ulong)&break_adr);
              std::operator<<((ostream *)&local_1a8,(string *)&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
            }
            else {
              std::operator<<((ostream *)&local_1a8,(string *)&break_adr);
            }
            std::istream::_M_extract<unsigned_int>((uint *)&ss);
            registe_ptr->R7 = break_num;
            printf("R7--------->%08X\n");
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
            str_00 = &break_adr;
LAB_00106063:
            std::__cxx11::string::~string((string *)str_00);
            goto LAB_00106068;
          }
LAB_0010600a:
          pcVar6 = &DAT_0010788f;
        }
        puts(pcVar6);
      }
    }
LAB_00106068:
    std::__cxx11::string::~string((string *)&str);
  }
  lvm_debug_c();
LAB_0010608c:
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void lvm_debug(int ins_len) {

	if (debug_flag != true) {
		printf("------------------------调试模式------------------------\n");
	}
	debug_flag = true;
	printf("IP--------->%08X\n", registe_ptr->IP);
FI:
	std::string str{ "" };
	std::cout << ">>>>";
YC:
	std::getline(std::cin, str);
	if (str.empty()) goto YC;
	if (str == "n")//单步
	{
		lvm_debug_n(ins_len);
		return;
	}
	else if (str == "e") {//退出调试
		lvm_debug_e();
		return;
	}
	else if (str == "c") {//运行程序
		lvm_debug_c();
		return;
	}
	else if (str == "u") {
		lvm_debug_u();
		goto FI;

	}
	else if (str == "p")//打印调试信息
	{
		lvm_debug_p();
		goto FI;//返回顶端
	}
	else if (*str.begin() == 'b') {
		auto temp = str.find(' ', 1);
		if (temp != std::string::npos) {
			std::string break_adr = str.substr(temp + 1);
			std::stringstream ss;
			ss.str("");
			unsigned break_num{ 0 };
			if (break_adr.substr(0, 2) == "0x")//16进制字符串
			{
				ss << std::hex << break_adr.substr(2);
				ss >> break_num;
			}
			else
			{
				ss << break_adr;
				ss >> break_num;
			}
			registe_ptr->R7 = break_num;
			printf("R7--------->%08X\n", registe_ptr->R7);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}
	else if (str[0] == 'd' && str[1] == 'b')
	{
		auto temp = str.find(' ', 2);
		if (temp != std::string::npos) {
			lvm_debug_d_s(data_ptr, str, temp);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}else if(str[0] == 's' && str[1] == 'b')
	{
		auto temp = str.find(' ', 2);
		if (temp != std::string::npos) {
			lvm_debug_d_s(stack_ptr,str,temp);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}
	else {
		printf("请输入正确的指令\n");
		goto FI;
	}

}